

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAA_ELSI.cpp
# Opt level: O1

void __thiscall
GMAA_MAA_ELSI::Fill_FirstOHtsI
          (GMAA_MAA_ELSI *this,Index ts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI)

{
  iterator __position;
  int iVar1;
  undefined4 extraout_var;
  LIndex i;
  undefined4 extraout_var_00;
  ulong uVar2;
  Index fI;
  Index local_2c;
  
  iVar1 = (*(this->super_GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete).
            super_PlanningUnitFactoredDecPOMDPDiscrete.super_PlanningUnitDecPOMDPDiscrete.
            super_PlanningUnitMADPDiscrete.super_PlanningUnit._vptr_PlanningUnit[6])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    uVar2 = 0;
    do {
      i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                    ((PlanningUnitMADPDiscrete *)this,(Index)uVar2,ts);
      local_2c = Globals::CastLIndexToIndex(i);
      __position._M_current =
           (firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)firstOHtsI,__position,
                   &local_2c);
      }
      else {
        *__position._M_current = local_2c;
        (firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar2 = (ulong)((Index)uVar2 + 1);
      iVar1 = (*(this->super_GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete).
                super_PlanningUnitFactoredDecPOMDPDiscrete.super_PlanningUnitDecPOMDPDiscrete.
                super_PlanningUnitMADPDiscrete.super_PlanningUnit._vptr_PlanningUnit[6])(this);
    } while (uVar2 < CONCAT44(extraout_var_00,iVar1));
  }
  return;
}

Assistant:

void  GMAA_MAA_ELSI::Fill_FirstOHtsI(Index ts, 
        vector<Index>& firstOHtsI)
{
    //because the OHs are constructed breath-first, we know the OHs for agent i
    //for this time step are numbered:
    //firstOHtsGI[i]...firstOHtsGI[i]+nrOH[i]-1
    //
    //(read first-OH-for-time-step-ts its Global Index)
    //
    //i.e. ohGI = ohI + firstOHtsGI 

    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        Index fI = CastLIndexToIndex(GetFirstObservationHistoryIndex(agI, ts));
        firstOHtsI.push_back(fI); 
    }
}